

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.hpp
# Opt level: O0

packer<msgpack::v1::sbuffer> * __thiscall
msgpack::v1::packer<msgpack::v1::sbuffer>::pack_str(packer<msgpack::v1::sbuffer> *this,uint32_t l)

{
  byte d_00;
  char cVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint in_ESI;
  packer<msgpack::v1::sbuffer> *in_RDI;
  uint32_t val_1;
  char buf_3 [5];
  uint16_t val;
  char buf_2 [3];
  char buf_1 [2];
  char buf;
  uchar d;
  undefined4 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe4;
  undefined1 in_stack_ffffffffffffffe5;
  undefined2 in_stack_ffffffffffffffe6;
  undefined2 in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffea;
  undefined1 in_stack_ffffffffffffffec;
  undefined1 in_stack_ffffffffffffffed;
  undefined1 uVar4;
  undefined2 in_stack_ffffffffffffffee;
  undefined1 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff1;
  undefined1 in_stack_fffffffffffffff2;
  undefined1 in_stack_fffffffffffffff3;
  
  if (in_ESI < 0x20) {
    d_00 = (byte)in_ESI | 0xa0;
    cVar1 = take8_8<unsigned_char>(d_00);
    append_buffer((packer<msgpack::v1::sbuffer> *)
                  CONCAT44(in_ESI,CONCAT13(d_00,CONCAT12(cVar1,CONCAT11(in_stack_fffffffffffffff1,
                                                                        in_stack_fffffffffffffff0)))
                          ),
                  (char *)CONCAT26(in_stack_ffffffffffffffee,
                                   CONCAT15(in_stack_ffffffffffffffed,
                                            CONCAT14(in_stack_ffffffffffffffec,
                                                     CONCAT22(in_stack_ffffffffffffffea,
                                                              in_stack_ffffffffffffffe8)))),
                  CONCAT26(in_stack_ffffffffffffffe6,
                           CONCAT15(in_stack_ffffffffffffffe5,
                                    CONCAT14(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))))
    ;
  }
  else if (in_ESI < 0x100) {
    append_buffer((packer<msgpack::v1::sbuffer> *)
                  CONCAT44(in_ESI,CONCAT13(in_stack_fffffffffffffff3,
                                           CONCAT12(in_stack_fffffffffffffff2,
                                                    CONCAT11((byte)in_ESI,0xd9)))),
                  (char *)CONCAT26(in_stack_ffffffffffffffee,
                                   CONCAT15(in_stack_ffffffffffffffed,
                                            CONCAT14(in_stack_ffffffffffffffec,
                                                     CONCAT22(in_stack_ffffffffffffffea,
                                                              in_stack_ffffffffffffffe8)))),
                  CONCAT26(in_stack_ffffffffffffffe6,
                           CONCAT15(in_stack_ffffffffffffffe5,
                                    CONCAT14(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))))
    ;
  }
  else if (in_ESI < 0x10000) {
    uVar4 = 0xda;
    uVar2 = ntohs((uint16_t)in_ESI);
    append_buffer((packer<msgpack::v1::sbuffer> *)
                  CONCAT44(in_ESI,CONCAT13(in_stack_fffffffffffffff3,
                                           CONCAT12(in_stack_fffffffffffffff2,
                                                    CONCAT11(in_stack_fffffffffffffff1,
                                                             in_stack_fffffffffffffff0)))),
                  (char *)CONCAT26(uVar2,CONCAT15(uVar4,CONCAT14(in_stack_ffffffffffffffec,
                                                                 CONCAT22(uVar2,
                                                  in_stack_ffffffffffffffe8)))),
                  CONCAT26(in_stack_ffffffffffffffe6,
                           CONCAT15(in_stack_ffffffffffffffe5,
                                    CONCAT14(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))))
    ;
  }
  else {
    uVar4 = 0xdb;
    uVar3 = ntohl(in_ESI);
    append_buffer((packer<msgpack::v1::sbuffer> *)
                  CONCAT44(in_ESI,CONCAT13(in_stack_fffffffffffffff3,
                                           CONCAT12(in_stack_fffffffffffffff2,
                                                    CONCAT11(in_stack_fffffffffffffff1,
                                                             in_stack_fffffffffffffff0)))),
                  (char *)CONCAT26(in_stack_ffffffffffffffee,
                                   CONCAT15(in_stack_ffffffffffffffed,
                                            CONCAT14(in_stack_ffffffffffffffec,
                                                     CONCAT22(in_stack_ffffffffffffffea,
                                                              (short)(uVar3 >> 0x10))))),
                  CONCAT26((short)uVar3,CONCAT15(uVar4,CONCAT14(in_stack_ffffffffffffffe4,uVar3))));
  }
  return in_RDI;
}

Assistant:

inline packer<Stream>& packer<Stream>::pack_str(uint32_t l)
{
    if(l < 32) {
        unsigned char d = static_cast<uint8_t>(0xa0u | l);
        char buf = take8_8(d);
        append_buffer(&buf, 1);
    } else if(l < 256) {
        char buf[2];
        buf[0] = static_cast<char>(0xd9u); buf[1] = static_cast<char>(l);
        append_buffer(buf, 2);
    } else if(l < 65536) {
        char buf[3];
        buf[0] = static_cast<char>(0xdau); _msgpack_store16(&buf[1], static_cast<uint16_t>(l));
        append_buffer(buf, 3);
    } else {
        char buf[5];
        buf[0] = static_cast<char>(0xdbu); _msgpack_store32(&buf[1], static_cast<uint32_t>(l));
        append_buffer(buf, 5);
    }
    return *this;
}